

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.cpp
# Opt level: O2

void __thiscall
r_exec::PrimaryMDLController::abduce_simulated_lhs
          (PrimaryMDLController *this,HLPBindingMap *bm,Fact *super_goal,Fact *f_imdl,bool opposite,
          double confidence,Sim *sim)

{
  atomic_int_fast64_t *paVar1;
  bool bVar2;
  MatchResult MVar3;
  Code *pCVar4;
  Goal *this_00;
  Goal *this_01;
  uint64_t after;
  Fact *this_02;
  _GMonitor *m;
  undefined8 uVar5;
  Sim *s;
  P<r_exec::_Fact> this_03;
  P<r_exec::_Fact> bound_lhs;
  _Fact *evidence;
  P<r_exec::_Fact> local_48;
  Goal *local_40;
  _Fact *local_38;
  
  local_40 = (Goal *)confidence;
  bVar2 = HLPController::evaluate_bwd_guards((HLPController *)this,bm);
  if (!bVar2) {
    return;
  }
  local_48.object =
       &HLPBindingMap::bind_pattern
                  (bm,(Code *)(this->super_PMDLController).super_MDLController.lhs.object)->
        super__Object;
  if ((Code *)local_48.object == (Code *)0x0) {
    this_03.object = (_Object *)0x0;
  }
  else {
    LOCK();
    paVar1 = &((_Object *)&(local_48.object)->_vptr__Object)->refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    this_03.object = local_48.object;
  }
  if (opposite) {
    _Fact::set_opposite((_Fact *)this_03.object);
    this_03.object = local_48.object;
  }
  _Fact::set_cfd((_Fact *)this_03.object,(double)local_40);
  MVar3 = HLPController::check_evidences((HLPController *)this,(_Fact *)local_48.object,&local_38);
  uVar5 = 1;
  if (MVar3 != MATCH_SUCCESS_POSITIVE) {
    if (MVar3 != MATCH_SUCCESS_NEGATIVE) {
      if (MVar3 != MATCH_FAILURE) goto LAB_00191d12;
      MVar3 = HLPController::check_predicted_evidences
                        ((HLPController *)this,(_Fact *)local_48.object,&local_38);
      if (MVar3 == MATCH_SUCCESS_POSITIVE) goto LAB_00191cfa;
      if (MVar3 == MATCH_FAILURE) {
        pCVar4 = (Code *)(**(code **)((long)(f_imdl->super__Fact).super_LObject.
                                            super_Object<r_code::LObject,_r_exec::LObject>.
                                            super_LObject.super_Code.super__Object._vptr__Object +
                                     0x48))(f_imdl,0);
        pCVar4 = HLPBindingMap::bind_pattern(bm,pCVar4);
        (**(code **)((long)(f_imdl->super__Fact).super_LObject.
                           super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                           super__Object._vptr__Object + 0x40))(f_imdl,0,pCVar4);
        this_00 = (Goal *)operator_new(0x160);
        local_40 = (Goal *)local_48.object;
        this_01 = _Fact::get_goal(&super_goal->super__Fact);
        pCVar4 = Goal::get_actor(this_01);
        Goal::Goal(this_00,(_Fact *)local_40,pCVar4,1.0);
        s = sim;
        local_40 = this_00;
        core::P<r_exec::Sim>::operator=(&this_00->sim,sim);
        after = (*Now)();
        this_02 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)s);
        Fact::Fact(this_02,(Code *)local_40,after,after,1.0,1.0);
        m = (_GMonitor *)operator_new(0xb8);
        SGMonitor::SGMonitor((SGMonitor *)m,this,&bm->super_BindingMap,sim->thz,this_02,f_imdl);
        PMDLController::add_g_monitor(&this->super_PMDLController,m);
        PMDLController::inject_simulation(&this->super_PMDLController,this_02);
        goto LAB_00191d12;
      }
      if (MVar3 != MATCH_SUCCESS_NEGATIVE) goto LAB_00191d12;
    }
    uVar5 = 0;
  }
LAB_00191cfa:
  (**(code **)((long)(this->super_PMDLController).super_MDLController.super_HLPController.
                     super_OController.super_Controller.super__Object._vptr__Object + 0x80))
            (this,super_goal,uVar5,local_38);
LAB_00191d12:
  core::P<r_exec::_Fact>::~P(&local_48);
  return;
}

Assistant:

void PrimaryMDLController::abduce_simulated_lhs(HLPBindingMap *bm, Fact *super_goal, Fact *f_imdl, bool opposite, double confidence, Sim *sim)   // goal is f->g->f->object or f->g->|f->object; called concurrently by redcue() and _GMonitor::update().
{
    if (evaluate_bwd_guards(bm)) { // bm may be updated.
        P<_Fact> bound_lhs = (_Fact *)bm->bind_pattern(get_lhs());

        if (opposite) {
            bound_lhs->set_opposite();
        }

        bound_lhs->set_cfd(confidence);
        _Fact *evidence;

        switch (check_evidences(bound_lhs, evidence)) {
        case MATCH_SUCCESS_POSITIVE: // an evidence is already known: stop the simulation.
            register_simulated_goal_outcome(super_goal, true, evidence);
            break;

        case MATCH_SUCCESS_NEGATIVE: // a counter evidence is already known: stop the simulation.
            register_simulated_goal_outcome(super_goal, false, evidence);
            break;

        case MATCH_FAILURE:
            switch (check_predicted_evidences(bound_lhs, evidence)) {
            case MATCH_SUCCESS_POSITIVE: // a predicted evidence is already known: stop the simulation.
                register_simulated_goal_outcome(super_goal, true, evidence);
                break;

            case MATCH_SUCCESS_NEGATIVE:
                register_simulated_goal_outcome(super_goal, false, evidence);
                break;

            case MATCH_FAILURE: {
                f_imdl->set_reference(0, bm->bind_pattern(f_imdl->get_reference(0))); // valuate f_imdl from updated bm.
                Goal *sub_goal = new Goal(bound_lhs, super_goal->get_goal()->get_actor(), 1);
                sub_goal->sim = sim;
                uint64_t now = Now();
                Fact *f_sub_goal = new Fact(sub_goal, now, now, 1, 1);
                add_g_monitor(new SGMonitor(this, bm, sim->thz, f_sub_goal, f_imdl));
                inject_simulation(f_sub_goal);
                break;
            }
            }

            break;
        }
    }
}